

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

int __thiscall QAccessibleTable::selectedRowCount(QAccessibleTable *this)

{
  QAbstractItemView *pQVar1;
  QItemSelectionModel *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QAbstractItemView *)view(this);
  pQVar2 = QAbstractItemView::selectionModel(pQVar1);
  if (pQVar2 == (QItemSelectionModel *)0x0) {
    local_30.size._0_4_ = 0;
  }
  else {
    pQVar1 = (QAbstractItemView *)view(this);
    QAbstractItemView::selectionModel(pQVar1);
    QItemSelectionModel::selectedRows((int)&local_30);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)local_30.size;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleTable::selectedRowCount() const
{
    if (!view()->selectionModel())
        return 0;
    return view()->selectionModel()->selectedRows().size();
}